

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordDouble *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  undefined7 in_register_00000009;
  string line;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000009,report_only_deviations) != 0) {
    if ((option->default_value == *option->value) &&
       (!NAN(option->default_value) && !NAN(*option->value))) {
      return;
    }
  }
  if (file_type == kFull) {
    fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
    highsBoolToString_abi_cxx11_(&local_b0,(option->super_OptionRecord).advanced,2);
    fprintf((FILE *)file,"# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
            option->lower_bound,option->upper_bound,option->default_value,local_b0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    fprintf((FILE *)file,"%s = %g\n",*option->value,
            (option->super_OptionRecord).name._M_dataplus._M_p);
  }
  else {
    if (file_type == kMd) {
      pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,
                 pcVar1 + (option->super_OptionRecord).name._M_string_length);
      highsInsertMdEscapes(&local_b0,&local_70);
      _Var2._M_p = local_b0._M_dataplus._M_p;
      pcVar1 = (option->super_OptionRecord).description._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,
                 pcVar1 + (option->super_OptionRecord).description._M_string_length);
      highsInsertMdEscapes(&local_50,&local_90);
      fprintf((FILE *)file,"## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
              option->lower_bound,option->upper_bound,option->default_value,_Var2._M_p,
              local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return;
      }
    }
    else {
      highsFormatToString_abi_cxx11_
                (&local_b0,"Set option %s to %g\n",*option->value,
                 (option->super_OptionRecord).name._M_dataplus._M_p);
      if (_stdout == file) {
        highsLogUser(log_options,kInfo,"%s");
      }
      else {
        fputs(local_b0._M_dataplus._M_p,(FILE *)file);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return;
      }
    }
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordDouble& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(
          file,
          "## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
          highsInsertMdEscapes(option.name).c_str(),
          highsInsertMdEscapes(option.description).c_str(), option.lower_bound,
          option.upper_bound, option.default_value);
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file,
              "# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
              highsBoolToString(option.advanced).c_str(), option.lower_bound,
              option.upper_bound, option.default_value);
      fprintf(file, "%s = %g\n", option.name.c_str(), *option.value);
    } else {
      std::string line = highsFormatToString(
          "Set option %s to %g\n", option.name.c_str(), *option.value);
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}